

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool,false,false>
               (interval_t *ldata,dtime_tz_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  dtime_tz_t left;
  dtime_tz_t left_00;
  ulong uVar3;
  dtime_tz_t dVar4;
  ulong uVar5;
  int64_t *piVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t *piVar11;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  date_t local_7c;
  dtime_tz_t *local_78;
  dtime_tz_t *local_70;
  undefined4 local_68;
  undefined4 local_64;
  int64_t *local_60;
  idx_t local_58;
  ulong local_50;
  ValidityMask *local_48;
  dtime_tz_t *local_40;
  dtime_tz_t *local_38;
  
  local_48 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      piVar11 = &ldata->micros;
      iVar7 = 0;
      do {
        dVar4.bits._0_4_ = ((interval_t *)(piVar11 + -1))->months;
        dVar4.bits._4_4_ = ((interval_t *)(piVar11 + -1))->days;
        local_64 = 0;
        right_01.micros = (int64_t)&local_64;
        right_01._0_8_ = *piVar11;
        dVar4 = Interval::Add((Interval *)rdata[iVar7].bits,dVar4,right_01,(date_t *)mask);
        result_data[iVar7].bits = dVar4.bits;
        iVar7 = iVar7 + 1;
        piVar11 = piVar11 + 2;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    piVar11 = &ldata->micros;
    uVar5 = 0;
    uVar9 = 0;
    local_78 = result_data;
    local_70 = rdata;
    local_60 = piVar11;
    local_58 = count;
    do {
      puVar1 = (local_48->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar8 = count;
        }
LAB_010728c6:
        uVar3 = uVar5;
        if (uVar5 < uVar8) {
          piVar6 = piVar11 + uVar5 * 2;
          do {
            left.bits._0_4_ = ((interval_t *)(piVar6 + -1))->months;
            left.bits._4_4_ = ((interval_t *)(piVar6 + -1))->days;
            local_7c.days = 0;
            right.micros = (int64_t)&local_7c;
            right._0_8_ = *piVar6;
            dVar4 = Interval::Add((Interval *)rdata[uVar5].bits,left,right,&local_7c);
            result_data[uVar5].bits = dVar4.bits;
            uVar5 = uVar5 + 1;
            piVar6 = piVar6 + 2;
            count = local_58;
            uVar3 = uVar8;
            piVar11 = local_60;
          } while (uVar8 != uVar5);
        }
      }
      else {
        uVar2 = puVar1[uVar9];
        uVar8 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar8 = count;
        }
        uVar3 = uVar8;
        result_data = local_78;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_010728c6;
          uVar3 = uVar5;
          rdata = local_70;
          if (uVar5 < uVar8) {
            local_38 = local_78 + uVar5;
            local_40 = local_70 + uVar5;
            piVar6 = piVar11 + uVar5 * 2;
            uVar10 = 0;
            do {
              if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
                left_00.bits._0_4_ = ((interval_t *)(piVar6 + -1))->months;
                left_00.bits._4_4_ = ((interval_t *)(piVar6 + -1))->days;
                local_68 = 0;
                right_00.micros = (int64_t)&local_68;
                right_00._0_8_ = *piVar6;
                dVar4 = Interval::Add((Interval *)local_40[uVar10].bits,left_00,right_00,&local_7c);
                local_38[uVar10].bits = dVar4.bits;
              }
              uVar10 = uVar10 + 1;
              piVar6 = piVar6 + 2;
              count = local_58;
              uVar3 = uVar8;
              result_data = local_78;
              rdata = local_70;
              piVar11 = local_60;
            } while (uVar8 - uVar5 != uVar10);
          }
        }
      }
      uVar5 = uVar3;
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}